

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CTables.h
# Opt level: O0

void __thiscall CTables::calcInterpolationTableInt(CTables *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  ulong uVar3;
  interpItemInt **ppiVar4;
  interpItemInt *piVar5;
  ostream *poVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int farWeightY_3;
  int nearWeightY_3;
  int farWeightX_3;
  int nearWeightX_3;
  int farWeightY_2;
  int nearWeightY_2;
  int farWeightX_2;
  int nearWeightX_2;
  int farWeightY_1;
  int nearWeightY_1;
  int farWeightX_1;
  int nearWeightX_1;
  int farWeightY;
  int nearWeightY;
  int farWeightX;
  int nearWeightX;
  int x;
  int y;
  CTables *this_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->cellSize;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppiVar4 = (interpItemInt **)operator_new__(uVar3);
  this->interpolationTableInt = ppiVar4;
  nearWeightX = -this->cellSize / 2;
  do {
    if (this->cellSize / 2 <= nearWeightX) {
      poVar6 = std::operator<<((ostream *)&std::cout,"interTable created");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      return;
    }
    auVar2._8_8_ = 0;
    auVar2._0_8_ = (long)this->cellSize;
    uVar3 = SUB168(auVar2 * ZEXT816(0x30),0);
    if (SUB168(auVar2 * ZEXT816(0x30),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    piVar5 = (interpItemInt *)operator_new__(uVar3);
    this->interpolationTableInt[nearWeightX + this->cellSize / 2] = piVar5;
    for (farWeightX = -this->cellSize / 2; farWeightX < this->cellSize / 2;
        farWeightX = farWeightX + 1) {
      if ((nearWeightX < 0) && (farWeightX < 0)) {
        iVar7 = this->cellSize + farWeightX + 1;
        iVar8 = this->cellSize - iVar7;
        iVar9 = this->cellSize + nearWeightX + 1;
        iVar10 = this->cellSize - iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[0] = iVar7 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][1] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[1] = iVar7 * iVar10;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][0] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[2] = iVar8 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][0] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][1] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[3] = iVar8 * iVar10;
      }
      else if ((nearWeightX < 0) && (-1 < farWeightX)) {
        iVar7 = this->cellSize - farWeightX;
        iVar8 = this->cellSize - iVar7;
        iVar9 = this->cellSize + nearWeightX + 1;
        iVar10 = this->cellSize - iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[0] = iVar7 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][1] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[1] = iVar7 * iVar10;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][0] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[2] = iVar8 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][0] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][1] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[3] = iVar8 * iVar10;
      }
      else if ((nearWeightX < 0) || (farWeightX < 0)) {
        if ((nearWeightX < 0) || (-1 < farWeightX)) {
          poVar6 = std::operator<<((ostream *)&std::cout,"err");
          std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
          exit(0);
        }
        iVar7 = this->cellSize + farWeightX + 1;
        iVar8 = this->cellSize - iVar7;
        iVar9 = this->cellSize - nearWeightX;
        iVar10 = this->cellSize - iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[0] = iVar7 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][1] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[1] = iVar7 * iVar10;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][0] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[2] = iVar8 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][0] = -1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][1] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[3] = iVar8 * iVar10;
      }
      else {
        iVar7 = this->cellSize - farWeightX;
        iVar8 = this->cellSize - iVar7;
        iVar9 = this->cellSize - nearWeightX;
        iVar10 = this->cellSize - iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[0][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[0] = iVar7 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][0] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[1][1] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[1] = iVar7 * iVar10;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][0] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[2][1] = 0;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[2] = iVar8 * iVar9;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][0] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].displace[3][1] = 1;
        this->interpolationTableInt[nearWeightX + this->cellSize / 2]
        [farWeightX + this->cellSize / 2].weightRatio[3] = iVar8 * iVar10;
      }
    }
    nearWeightX = nearWeightX + 1;
  } while( true );
}

Assistant:

void CTables::calcInterpolationTableInt()
{
    interpolationTableInt = new interpItemInt*[cellSize];
    for(int y=-cellSize/2; y<cellSize/2; y++)
    {
        interpolationTableInt[y+cellSize/2] = new interpItemInt[cellSize];
        for(int x=-cellSize/2; x<cellSize/2; x++)
        {
            if(y<0 && x <0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y<0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize + y + 1;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x>=0)
            {
                int nearWeightX = cellSize - x;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else if(y>=0 && x<0)
            {
                int nearWeightX = cellSize + x + 1;
                int farWeightX = cellSize - nearWeightX;
                int nearWeightY = cellSize - y;
                int farWeightY = cellSize - nearWeightY;
                //cout<<nearWeightX<<"\t"<<nearWeightY<<endl;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[0][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[0] = nearWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][0] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[1][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[1] = nearWeightX*farWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[2][1] = 0;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[2] = farWeightX*nearWeightY;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][0] = -1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].displace[3][1] = 1;
                interpolationTableInt[y+cellSize/2][x+cellSize/2].weightRatio[3] = farWeightX*farWeightY;
            }
            else
            {
                cout<<"err"<<endl;
                exit(0);
            }
        }
    }
    cout<<"interTable created"<<endl;
}